

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cc
# Opt level: O0

string * avro::toString_abi_cxx11_(Type type)

{
  bool bVar1;
  int iVar2;
  Type in_EDI;
  allocator<char> *in_stack_00000010;
  undefined4 in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  allocator<char> local_d;
  Type local_c;
  string *local_8;
  
  local_c = in_EDI;
  if (toString[abi:cxx11](avro::Type)::undefinedType_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&toString[abi:cxx11](avro::Type)::undefinedType_abi_cxx11_);
    if (iVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_00000020,(char *)CONCAT44(type,in_stack_00000018),in_stack_00000010);
      std::allocator<char>::~allocator(&local_d);
      __cxa_atexit(std::__cxx11::string::~string,
                   &toString[abi:cxx11](avro::Type)::undefinedType_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&toString[abi:cxx11](avro::Type)::undefinedType_abi_cxx11_);
    }
  }
  bVar1 = isAvroTypeOrPseudoType(local_c);
  if (bVar1) {
    local_8 = (string *)(strings::typeToString_abi_cxx11_ + (long)local_c * 0x20);
  }
  else {
    local_8 = &toString[abi:cxx11](avro::Type)::undefinedType_abi_cxx11_;
  }
  return local_8;
}

Assistant:

const std::string& toString(Type type)
{
    static std::string undefinedType = "Undefined type";
    if (isAvroTypeOrPseudoType(type)) {
        return strings::typeToString[type];
    } else {
        return undefinedType;
    }
}